

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZShapeHDiv.cpp
# Opt level: O1

void TPZShapeHDiv<pzshape::TPZShapePrism>::HDivPermutation
               (MElementType eltype,TPZVec<long> *ids,TPZVec<int> *permutegather)

{
  int iVar1;
  
  switch(eltype) {
  case EPoint:
    *permutegather->fStore = 0;
    return;
  case EOned:
    iVar1 = pztopology::TPZLine::GetTransformId(ids);
    pztopology::TPZLine::GetSideHDivPermutation(iVar1,permutegather);
    return;
  case ETriangle:
    iVar1 = pztopology::TPZTriangle::GetTransformId(ids);
    pztopology::TPZTriangle::GetSideHDivPermutation(iVar1,permutegather);
    return;
  case EQuadrilateral:
    iVar1 = pztopology::TPZQuadrilateral::GetTransformId(ids);
    pztopology::TPZQuadrilateral::GetSideHDivPermutation(iVar1,permutegather);
    return;
  default:
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Shape/TPZShapeHDiv.cpp"
               ,0x185);
  }
}

Assistant:

void TPZShapeHDiv<TSHAPE>::HDivPermutation(MElementType eltype, const TPZVec<int64_t> &ids, TPZVec<int> &permutegather)
{
    int transformid;
    switch (eltype) {
        case EOned:
            transformid = pztopology::TPZLine::GetTransformId(ids);
            pztopology::TPZLine::GetSideHDivPermutation(transformid, permutegather);
            break;
        case EQuadrilateral:
            transformid = pztopology::TPZQuadrilateral::GetTransformId(ids);
            pztopology::TPZQuadrilateral::GetSideHDivPermutation(transformid, permutegather);
            break;
        case ETriangle:
            transformid = pztopology::TPZTriangle::GetTransformId(ids);
            pztopology::TPZTriangle::GetSideHDivPermutation(transformid, permutegather);
            break;
        case EPoint:
            transformid = 0;
            permutegather[0] = 0;
            break;
        default:
            DebugStop();
            break;
    }

}